

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

void emit_varname(Function *fn,Pseudo *pseudo)

{
  uint uVar1;
  
  uVar1 = (*(uint *)pseudo & 0xf) - 1;
  if (uVar1 < 3) {
    raviX_buffer_add_fstring
              (&fn->body,"%s%d",&DAT_0013a450 + *(int *)(&DAT_0013a450 + (ulong)uVar1 * 4),
               (ulong)(*(uint *)pseudo >> 4 & 0xffff));
    return;
  }
  handle_error_bad_pseudo(fn,pseudo,"Unexpected pseudo type");
}

Assistant:

static void emit_varname(Function *fn, const Pseudo *pseudo)
{
	TextBuffer *mb = &fn->body;
	if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_BOOL) {
		raviX_buffer_add_fstring(mb, "%s%d", int_var_prefix, pseudo->regnum);
	} else if (pseudo->type == PSEUDO_TEMP_FLT) {
		raviX_buffer_add_fstring(mb, "%s%d", flt_var_prefix, pseudo->regnum);
	} else {
		handle_error_bad_pseudo(fn, pseudo, "Unexpected pseudo type");
	}
}